

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<char> * __thiscall
cimg_library::CImg<char>::get_crop
          (CImg<char> *__return_storage_ptr__,CImg<char> *this,int x0,int y0,int z0,int c0,int x1,
          int y1,int z1,int c1,uint boundary_conditions)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  CImg<char> *this_00;
  CImgInstanceException *this_01;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  undefined1 auVar34 [16];
  char local_89;
  int local_88;
  undefined4 uStack_84;
  int local_80;
  undefined4 uStack_7c;
  
  if ((this->_data != (char *)0x0) &&
     (auVar34._0_4_ = -(uint)(this->_width == 0), auVar34._4_4_ = -(uint)(this->_height == 0),
     auVar34._8_4_ = -(uint)(this->_depth == 0), auVar34._12_4_ = -(uint)(this->_spectrum == 0),
     uVar9 = movmskps((int)this,auVar34), (char)uVar9 == '\0')) {
    uVar15 = x1;
    if (x0 < x1) {
      uVar15 = x0;
    }
    uVar29 = x1 ^ x0 ^ uVar15;
    uVar10 = y1;
    if (y0 < y1) {
      uVar10 = y0;
    }
    uVar33 = y1 ^ y0 ^ uVar10;
    uVar23 = z1;
    if (z0 < z1) {
      uVar23 = z0;
    }
    _local_80 = CONCAT44(uStack_7c,-uVar23);
    uVar18 = z1 ^ z0 ^ uVar23;
    uVar25 = c1;
    if (c0 < c1) {
      uVar25 = c0;
    }
    _local_88 = CONCAT44(uStack_84,-uVar25);
    uVar27 = c1 ^ c0 ^ uVar25;
    CImg(__return_storage_ptr__,(uVar29 - uVar15) + 1,(uVar33 - uVar10) + 1,(uVar18 - uVar23) + 1,
         (uVar27 - uVar25) + 1);
    if ((((((int)uVar15 < 0) || ((int)uVar10 < 0)) || ((int)this->_width <= (int)uVar29)) ||
        (((int)uVar23 < 0 || ((int)this->_height <= (int)uVar33)))) ||
       (((int)uVar25 < 0 ||
        (((int)this->_depth <= (int)uVar18 || ((int)this->_spectrum <= (int)uVar27)))))) {
      if (boundary_conditions == 3) {
        uVar29 = __return_storage_ptr__->_spectrum;
        if (0 < (int)uVar29) {
          iVar5 = this->_width * 2;
          iVar6 = this->_height * 2;
          iVar7 = this->_depth * 2;
          iVar8 = this->_spectrum * 2;
          uVar33 = __return_storage_ptr__->_depth;
          lVar21 = 0;
          do {
            if (0 < (int)uVar33) {
              uVar12 = (int)uVar25 + lVar21;
              uVar29 = __return_storage_ptr__->_height;
              lVar20 = 0;
              do {
                if (0 < (int)uVar29) {
                  uVar14 = (int)uVar23 + lVar20;
                  uVar32 = (ulong)__return_storage_ptr__->_width;
                  lVar19 = 0;
                  do {
                    if (0 < (int)uVar32) {
                      uVar24 = lVar19 + (int)uVar10;
                      uVar29 = (uint)((long)((ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 |
                                            uVar24 & 0xffffffff) % (long)iVar6);
                      uVar33 = uVar29 + iVar6;
                      if (uVar29 == 0) {
                        uVar33 = uVar29;
                      }
                      if (-1 < (long)uVar24) {
                        uVar33 = uVar29;
                      }
                      uVar29 = (uint)((long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 |
                                            uVar14 & 0xffffffff) % (long)iVar7);
                      uVar18 = uVar29 + iVar7;
                      if (uVar29 == 0) {
                        uVar18 = uVar29;
                      }
                      if (-1 < (long)uVar14) {
                        uVar18 = uVar29;
                      }
                      uVar27 = (uint)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 |
                                            uVar12 & 0xffffffff) % (long)iVar8);
                      uVar29 = uVar27 + iVar8;
                      if (uVar27 == 0) {
                        uVar29 = uVar27;
                      }
                      if (-1 < (long)uVar12) {
                        uVar29 = uVar27;
                      }
                      lVar30 = 0;
                      uVar24 = (long)(int)uVar15;
                      do {
                        uVar17 = (uint)((long)((ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 |
                                              uVar24 & 0xffffffff) % (long)iVar5);
                        uVar27 = uVar17 + iVar5;
                        if (uVar17 == 0) {
                          uVar27 = uVar17;
                        }
                        if (-1 < (long)uVar24) {
                          uVar27 = uVar17;
                        }
                        uVar17 = this->_width;
                        uVar2 = ~uVar27 + iVar5;
                        if ((int)uVar27 < (int)uVar17) {
                          uVar2 = uVar27;
                        }
                        uVar27 = ~uVar33 + iVar6;
                        if ((int)uVar33 < (int)this->_height) {
                          uVar27 = uVar33;
                        }
                        uVar3 = ~uVar18 + iVar7;
                        if ((int)uVar18 < (int)this->_depth) {
                          uVar3 = uVar18;
                        }
                        uVar4 = ~uVar29 + iVar8;
                        if ((int)uVar29 < (int)this->_spectrum) {
                          uVar4 = uVar29;
                        }
                        lVar26 = (ulong)this->_height * (ulong)uVar17;
                        __return_storage_ptr__->_data
                        [lVar30 + (((ulong)__return_storage_ptr__->_depth * lVar21 + lVar20) *
                                   (ulong)__return_storage_ptr__->_height + lVar19) *
                                  (uVar32 & 0xffffffff)] =
                             this->_data
                             [(ulong)uVar4 * (ulong)this->_depth * lVar26 +
                              (ulong)uVar3 * lVar26 + (ulong)uVar2 + (ulong)uVar27 * (ulong)uVar17];
                        lVar30 = lVar30 + 1;
                        uVar32 = (ulong)(int)__return_storage_ptr__->_width;
                        uVar24 = uVar24 + 1;
                      } while (lVar30 < (long)uVar32);
                      uVar29 = __return_storage_ptr__->_height;
                    }
                    lVar19 = lVar19 + 1;
                  } while (lVar19 < (int)uVar29);
                  uVar33 = __return_storage_ptr__->_depth;
                }
                lVar20 = lVar20 + 1;
              } while (lVar20 < (int)uVar33);
              uVar29 = __return_storage_ptr__->_spectrum;
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 < (int)uVar29);
        }
      }
      else if (boundary_conditions == 2) {
        uVar29 = __return_storage_ptr__->_spectrum;
        if (0 < (int)uVar29) {
          uVar33 = __return_storage_ptr__->_depth;
          lVar21 = 0;
          do {
            if (0 < (int)uVar33) {
              uVar12 = lVar21 + (int)uVar25;
              uVar29 = __return_storage_ptr__->_height;
              lVar20 = 0;
              do {
                if (0 < (int)uVar29) {
                  uVar14 = lVar20 + (int)uVar23;
                  uVar32 = (ulong)__return_storage_ptr__->_width;
                  lVar19 = 0;
                  do {
                    if (0 < (int)uVar32) {
                      uVar13 = (int)uVar10 + lVar19;
                      lVar30 = 0;
                      uVar24 = (long)(int)uVar15;
                      do {
                        uVar29 = this->_width;
                        uVar33 = this->_height;
                        uVar1 = (long)((ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 |
                                      uVar24 & 0xffffffff) % (long)(int)uVar29;
                        uVar28 = (ulong)((int)uVar1 + uVar29);
                        if ((int)uVar1 == 0) {
                          uVar28 = uVar1 & 0xffffffff;
                        }
                        if (-1 < (long)uVar24) {
                          uVar28 = uVar1 & 0xffffffff;
                        }
                        uVar1 = (long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 |
                                      uVar13 & 0xffffffff) % (long)(int)uVar33;
                        uVar31 = (ulong)((int)uVar1 + uVar33);
                        if ((int)uVar1 == 0) {
                          uVar31 = uVar1 & 0xffffffff;
                        }
                        if (-1 < (long)uVar13) {
                          uVar31 = uVar1 & 0xffffffff;
                        }
                        uVar18 = this->_depth;
                        uVar1 = (long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 |
                                      uVar14 & 0xffffffff) % (long)(int)uVar18;
                        uVar16 = (ulong)((int)uVar1 + uVar18);
                        if ((int)uVar1 == 0) {
                          uVar16 = uVar1 & 0xffffffff;
                        }
                        if (-1 < (long)uVar14) {
                          uVar16 = uVar1 & 0xffffffff;
                        }
                        uVar1 = (long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 |
                                      uVar12 & 0xffffffff) % (long)(int)this->_spectrum;
                        uVar22 = (ulong)(this->_spectrum + (int)uVar1);
                        if ((int)uVar1 == 0) {
                          uVar22 = uVar1 & 0xffffffff;
                        }
                        if (-1 < (long)uVar12) {
                          uVar22 = uVar1 & 0xffffffff;
                        }
                        lVar26 = (ulong)uVar33 * (ulong)uVar29;
                        __return_storage_ptr__->_data
                        [lVar30 + (((ulong)__return_storage_ptr__->_depth * lVar21 + lVar20) *
                                   (ulong)__return_storage_ptr__->_height + lVar19) *
                                  (uVar32 & 0xffffffff)] =
                             this->_data
                             [lVar26 * (ulong)uVar18 * uVar22 +
                              uVar16 * lVar26 + uVar28 + uVar31 * uVar29];
                        lVar30 = lVar30 + 1;
                        uVar32 = (ulong)(int)__return_storage_ptr__->_width;
                        uVar24 = uVar24 + 1;
                      } while (lVar30 < (long)uVar32);
                      uVar29 = __return_storage_ptr__->_height;
                    }
                    lVar19 = lVar19 + 1;
                  } while (lVar19 < (int)uVar29);
                  uVar33 = __return_storage_ptr__->_depth;
                }
                lVar20 = lVar20 + 1;
              } while (lVar20 < (int)uVar33);
              uVar29 = __return_storage_ptr__->_spectrum;
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 < (int)uVar29);
        }
      }
      else if (boundary_conditions == 1) {
        uVar15 = __return_storage_ptr__->_spectrum;
        if (0 < (int)uVar15) {
          uVar29 = __return_storage_ptr__->_depth;
          if (x1 < x0) {
            x0 = x1;
          }
          lVar21 = 0;
          do {
            if (0 < (int)uVar29) {
              uVar15 = __return_storage_ptr__->_height;
              lVar20 = 0;
              do {
                if (0 < (int)uVar15) {
                  uVar12 = (ulong)__return_storage_ptr__->_width;
                  lVar19 = 0;
                  do {
                    if (0 < (int)uVar12) {
                      lVar30 = 0;
                      do {
                        pcVar11 = _atXYZC(this,x0 + (int)lVar30,uVar10 + (int)lVar19,
                                          uVar23 + (int)lVar20,uVar25 + (int)lVar21);
                        __return_storage_ptr__->_data
                        [lVar30 + (((ulong)__return_storage_ptr__->_depth * lVar21 + lVar20) *
                                   (ulong)__return_storage_ptr__->_height + lVar19) *
                                  (ulong)__return_storage_ptr__->_width] = *pcVar11;
                        lVar30 = lVar30 + 1;
                        uVar12 = (ulong)(int)__return_storage_ptr__->_width;
                      } while (lVar30 < (long)uVar12);
                      uVar15 = __return_storage_ptr__->_height;
                    }
                    lVar19 = lVar19 + 1;
                  } while (lVar19 < (int)uVar15);
                  uVar29 = __return_storage_ptr__->_depth;
                }
                lVar20 = lVar20 + 1;
              } while (lVar20 < (int)uVar29);
              uVar15 = __return_storage_ptr__->_spectrum;
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 < (int)uVar15);
        }
      }
      else {
        local_89 = '\0';
        this_00 = fill(__return_storage_ptr__,&local_89);
        draw_image(this_00,-uVar15,-uVar10,local_80,local_88,this,1.0);
      }
    }
    else {
      draw_image(__return_storage_ptr__,-uVar15,-uVar10,local_80,local_88,this,1.0);
    }
    return __return_storage_ptr__;
  }
  this_01 = (CImgInstanceException *)__cxa_allocate_exception(0x10);
  pcVar11 = "non-";
  if (this->_is_shared != false) {
    pcVar11 = "";
  }
  CImgInstanceException::CImgInstanceException
            (this_01,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::crop(): Empty instance.",
             (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar11,"char");
  __cxa_throw(this_01,&CImgInstanceException::typeinfo,CImgException::~CImgException);
}

Assistant:

CImg<T> get_crop(const int x0, const int y0, const int z0, const int c0,
                     const int x1, const int y1, const int z1, const int c1,
                     const unsigned int boundary_conditions=0) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "crop(): Empty instance.",
                                    cimg_instance);
      const int
        nx0 = x0<x1?x0:x1, nx1 = x0^x1^nx0,
        ny0 = y0<y1?y0:y1, ny1 = y0^y1^ny0,
        nz0 = z0<z1?z0:z1, nz1 = z0^z1^nz0,
        nc0 = c0<c1?c0:c1, nc1 = c0^c1^nc0;
      CImg<T> res(1U + nx1 - nx0,1U + ny1 - ny0,1U + nz1 - nz0,1U + nc1 - nc0);
      if (nx0<0 || nx1>=width() || ny0<0 || ny1>=height() || nz0<0 || nz1>=depth() || nc0<0 || nc1>=spectrum())
        switch (boundary_conditions) {
        case 3 : { // Mirror
          const int w2 = 2*width(), h2 = 2*height(), d2 = 2*depth(), s2 = 2*spectrum();
          cimg_pragma_openmp(parallel for cimg_openmp_collapse(3) cimg_openmp_if(_width>=(cimg_openmp_sizefactor)*16 &&
                                                                     _height*_depth*_spectrum>=4))
          cimg_forXYZC(res,x,y,z,c) {
            const int
              mx = cimg::mod(nx0 + x,w2),
              my = cimg::mod(ny0 + y,h2),
              mz = cimg::mod(nz0 + z,d2),
              mc = cimg::mod(nc0 + c,s2);
            res(x,y,z,c) = (*this)(mx<width()?mx:w2 - mx - 1,
                                   my<height()?my:h2 - my - 1,
                                   mz<depth()?mz:d2 - mz - 1,
                                   mc<spectrum()?mc:s2 - mc - 1);
          }
        } break;
        case 2 : { // Periodic
          cimg_pragma_openmp(parallel for cimg_openmp_collapse(3) cimg_openmp_if(_width>=(cimg_openmp_sizefactor)*16 &&
                                                                     _height*_depth*_spectrum>=4))
          cimg_forXYZC(res,x,y,z,c) {
            res(x,y,z,c) = (*this)(cimg::mod(nx0 + x,width()),cimg::mod(ny0 + y,height()),
                                   cimg::mod(nz0 + z,depth()),cimg::mod(nc0 + c,spectrum()));
          }
        } break;
        case 1 : // Neumann
          cimg_pragma_openmp(parallel for cimg_openmp_collapse(3) cimg_openmp_if(_width>=(cimg_openmp_sizefactor)*16 &&
                                                                     _height*_depth*_spectrum>=4))
          cimg_forXYZC(res,x,y,z,c) res(x,y,z,c) = _atXYZC(nx0 + x,ny0 + y,nz0 + z,nc0 + c);
          break;
        default : // Dirichlet
          res.fill((T)0).draw_image(-nx0,-ny0,-nz0,-nc0,*this);
        }
      else res.draw_image(-nx0,-ny0,-nz0,-nc0,*this);
      return res;
    }